

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O2

int __thiscall
wasm::
TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>
::Selector::select(Selector *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
                  fd_set *__exceptfds,timeval *__timeout)

{
  Index a;
  uint uVar1;
  pointer puVar2;
  pointer pvVar3;
  uint *puVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  pointer puVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  pointer puVar12;
  undefined4 in_register_00000034;
  TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>
  *this_00;
  uint *puVar13;
  long lVar14;
  
  this_00 = (TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>
             *)CONCAT44(in_register_00000034,__nfds);
  if (this->count == 0) {
    __assert_fail("count >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                  ,0xde,
                  "Selector wasm::TopologicalOrdersImpl<(lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector::select(TopologicalOrdersImpl<F> &) [Cmp = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)]"
                 );
  }
  uVar9 = this->start;
  puVar8 = (this_00->buf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this_00->buf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 2) <
      (ulong)(this->count + uVar9)) {
    __assert_fail("start + count <= ctx.buf.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                  ,0xdf,
                  "Selector wasm::TopologicalOrdersImpl<(lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector::select(TopologicalOrdersImpl<F> &) [Cmp = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)]"
                 );
  }
  puVar2 = (this_00->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar12 = (this_00->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (4 < (long)puVar12 - (long)puVar2) {
    a = puVar12[-1];
    puVar12[-1] = *puVar2;
    uVar11 = (long)puVar12 + (-4 - (long)puVar2);
    lVar6 = (long)uVar11 >> 2;
    lVar14 = 0;
    while (lVar14 < (lVar6 + -1) / 2) {
      bVar5 = anon_class_16_2_849a5f34_for_cmp::operator()
                        (&this_00->cmp,puVar2[lVar14 * 2 + 1],puVar2[lVar14 * 2 + 2]);
      if (bVar5) {
        lVar7 = lVar14 * 2 + 1;
      }
      else {
        lVar7 = lVar14 * 2 + 2;
      }
      puVar2[lVar14] = puVar2[lVar7];
      lVar14 = lVar7;
    }
    if ((uVar11 & 4) != 0) goto LAB_00918f0b;
    if (lVar14 != lVar6 + -2 >> 1) goto LAB_00918f0b;
    lVar6 = lVar14;
    lVar7 = lVar14 * 2 + 1;
    do {
      lVar14 = lVar7;
      puVar2[lVar6] = puVar2[lVar14];
LAB_00918f0b:
      if (lVar14 < 1) break;
      lVar7 = (lVar14 + -1) / 2;
      bVar5 = anon_class_16_2_849a5f34_for_cmp::operator()(&this_00->cmp,a,puVar2[lVar7]);
      lVar6 = lVar14;
    } while (bVar5);
    puVar2[lVar14] = a;
    puVar8 = (this_00->buf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar12 = (this_00->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar9 = this->start;
  }
  uVar1 = puVar12[-1];
  (this_00->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar12 + -1;
  puVar8[uVar9] = uVar1;
  uVar9 = this->start;
  pvVar3 = (this_00->graph->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar13 = *(uint **)&pvVar3[puVar8[uVar9]].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
  puVar4 = *(pointer *)
            ((long)&pvVar3[puVar8[uVar9]].
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8);
  while( true ) {
    if (puVar13 == puVar4) {
      return uVar9 + 1;
    }
    uVar1 = *puVar13;
    puVar8 = (this_00->indegrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar10 = puVar8[uVar1];
    if (uVar10 == 0) break;
    uVar10 = uVar10 - 1;
    puVar8[uVar1] = uVar10;
    if (uVar10 == 0) {
      pushChoice(this_00,uVar1);
    }
    puVar13 = puVar13 + 1;
  }
  __assert_fail("ctx.indegrees[child] > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                ,0xea,
                "Selector wasm::TopologicalOrdersImpl<(lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector::select(TopologicalOrdersImpl<F> &) [Cmp = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)]"
               );
}

Assistant:

Selector select(TopologicalOrdersImpl& ctx) {
      assert(count >= 1);
      assert(start + count <= ctx.buf.size());
      if constexpr (TopologicalOrdersImpl::useMinHeap) {
        ctx.buf[start] = ctx.popChoice();
      }
      auto selection = ctx.buf[start];
      // The next selector will select the next index and will not be able to
      // choose the vertex we just selected.
      Selector next = {start + 1, count - 1, 0};
      // Append any child that this selection makes available to the choices for
      // the next selector.
      for (auto child : ctx.graph[selection]) {
        assert(ctx.indegrees[child] > 0);
        if (--ctx.indegrees[child] == 0) {
          if constexpr (TopologicalOrdersImpl::useMinHeap) {
            ctx.pushChoice(child);
          } else {
            ctx.buf[next.start + next.count] = child;
          }
          ++next.count;
        }
      }
      return next;
    }